

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupStrashReduce(Gia_Man_t *p,Vec_Wec_t *vSupps,Vec_Int_t **pvCoMap)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Gia_Man_t *p_01;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  void *__s;
  Gia_Man_t *pGVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  Gia_Obj_t *pGVar18;
  long lVar19;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xfe5,"Gia_Man_t *Gia_ManDupStrashReduce(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t **)"
                 );
  }
  Gia_ManFillValue(p);
  iVar5 = p->vCos->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar12 = iVar5;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar12;
  if (iVar12 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar12 << 2);
  }
  p_00->pArray = piVar6;
  p_01 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_01->pName = pcVar8;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_01->pSpec = pcVar8;
  p->pObjs->Value = 0;
  iVar5 = Gia_ManCoSuppSizeMax(p,vSupps);
  if (0 < iVar5) {
    do {
      pGVar9 = Gia_ManAppendObj(p_01);
      uVar14 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar14 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar14 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_01->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + p_01->nObjs <= pGVar9)) {
LAB_001f1e25:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
      if ((pGVar9 < p_01->pObjs) || (p_01->pObjs + p_01->nObjs <= pGVar9)) goto LAB_001f1e25;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  Gia_ManHashAlloc(p_01);
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    lVar19 = 0;
    do {
      iVar5 = pVVar10->pArray[lVar19];
      if (((long)iVar5 < 0) || (iVar12 = p->nObjs, iVar12 <= iVar5)) {
LAB_001f1de7:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if (vSupps->nSize <= lVar19) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pGVar9 = pGVar3 + iVar5;
      uVar15 = vSupps->pArray[lVar19].nSize;
      if ((ulong)uVar15 == 0) {
        uVar15 = *(uint *)pGVar9 >> 0x1d & 1;
LAB_001f1aab:
        Vec_IntPush(p_00,uVar15);
      }
      else {
        if (uVar15 == 1) {
          uVar15 = *(uint *)pGVar9 >> 0x1d & 1 | 2;
          goto LAB_001f1aab;
        }
        if (0 < (int)uVar15) {
          piVar6 = vSupps->pArray[lVar19].pArray;
          pVVar10 = p_01->vCis;
          uVar13 = pVVar10->nSize;
          uVar14 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar14 = 0;
          }
          uVar16 = 0;
          do {
            if (uVar14 == uVar16) goto LAB_001f1e06;
            iVar5 = pVVar10->pArray[uVar16];
            if (((long)iVar5 < 0) || (p_01->nObjs <= iVar5)) goto LAB_001f1de7;
            pGVar4 = p_01->pObjs;
            pGVar18 = (Gia_Obj_t *)((ulong)(pGVar4 + iVar5) & 0xfffffffffffffffe);
            if ((pGVar18 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar18)) goto LAB_001f1e25;
            iVar17 = (int)((ulong)((long)pGVar18 - (long)pGVar4) >> 2);
            if (iVar17 * -0x55555555 < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            uVar13 = piVar6[uVar16];
            if (((int)uVar13 < 0) || (p->vCis->nSize <= (int)uVar13)) goto LAB_001f1e06;
            iVar1 = p->vCis->pArray[uVar13];
            if (((long)iVar1 < 0) || (iVar12 <= iVar1)) goto LAB_001f1de7;
            pGVar3[iVar1].Value = ((uint)(pGVar4 + iVar5) & 1) + iVar17 * 0x55555556;
            uVar16 = uVar16 + 1;
          } while (uVar15 != uVar16);
        }
        Gia_ManDupHashDfs_rec(p_01,p,pGVar9 + -(*(ulong *)pGVar9 & 0x1fffffff));
        if ((int)pGVar9[-(*(ulong *)pGVar9 & 0x1fffffff)].Value < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar15 = (uint)(*(ulong *)pGVar9 >> 0x1d) & 1 ^
                 pGVar9[-(*(ulong *)pGVar9 & 0x1fffffff)].Value;
        if (p_01->nObjs * 2 <= (int)uVar15) {
          __assert_fail("Gia_ObjFanin0Copy(pObj) < 2 * Gia_ManObjNum(pNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                        ,0xffc,
                        "Gia_Man_t *Gia_ManDupStrashReduce(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t **)")
          ;
        }
        Vec_IntPush(p_00,uVar15);
        Gia_ManDupCleanDfs_rec(pGVar9 + -(ulong)((uint)*(ulong *)pGVar9 & 0x1fffffff));
      }
      lVar19 = lVar19 + 1;
      pVVar10 = p->vCos;
    } while (lVar19 < pVVar10->nSize);
  }
  Gia_ManHashStop(p_01);
  uVar15 = p_00->nSize;
  uVar13 = p->vCos->nSize;
  if (uVar15 != uVar13) {
    __assert_fail("Vec_IntSize(vCoMapLit) == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x1002,
                  "Gia_Man_t *Gia_ManDupStrashReduce(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t **)");
  }
  if (pvCoMap == (Vec_Int_t **)0x0) {
    if (0 < (int)uVar15) {
      piVar6 = p_00->pArray;
      uVar14 = 0;
      do {
        Gia_ManAppendCo(p_01,piVar6[uVar14]);
        uVar14 = uVar14 + 1;
      } while (uVar15 != uVar14);
    }
  }
  else {
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    if (uVar13 - 1 < 0xf) {
      uVar13 = 0x10;
    }
    pVVar10->nSize = 0;
    pVVar10->nCap = uVar13;
    if (uVar13 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc((long)(int)uVar13 << 2);
    }
    pVVar10->pArray = piVar6;
    iVar5 = p_01->nObjs;
    iVar12 = iVar5 * 2;
    iVar17 = 0x10;
    if (0xe < iVar12 - 1U) {
      iVar17 = iVar12;
    }
    if (iVar17 == 0) {
      __s = (void *)0x0;
    }
    else {
      __s = malloc((long)iVar17 << 2);
    }
    if (__s != (void *)0x0) {
      memset(__s,0xff,(long)iVar5 << 3);
    }
    if (0 < (int)uVar15) {
      piVar6 = p_00->pArray;
      uVar14 = 0;
      do {
        iVar5 = piVar6[uVar14];
        lVar19 = (long)iVar5;
        if ((lVar19 < 0) || (iVar12 <= iVar5)) {
LAB_001f1e06:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*(int *)((long)__s + lVar19 * 4) == -1) {
          *(int *)((long)__s + lVar19 * 4) = p_01->vCos->nSize;
          Gia_ManAppendCo(p_01,iVar5);
        }
        Vec_IntPush(pVVar10,*(int *)((long)__s + lVar19 * 4));
        uVar14 = uVar14 + 1;
      } while (uVar15 != uVar14);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    *pvCoMap = pVVar10;
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  pGVar11 = Gia_ManCleanup(p_01);
  Gia_ManStop(p_01);
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_ManDupStrashReduce( Gia_Man_t * p, Vec_Wec_t * vSupps, Vec_Int_t ** pvCoMap )
{
    Gia_Obj_t * pObj;
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vSuppOne, * vCoMapLit;
    int i, k, iCi, iLit, nSuppMax;
    assert( Gia_ManRegNum(p) == 0 );
    Gia_ManFillValue( p );
    vCoMapLit = Vec_IntAlloc( Gia_ManCoNum(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    nSuppMax = Gia_ManCoSuppSizeMax( p, vSupps );
    for ( i = 0; i < nSuppMax; i++ )
        Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
    {
        vSuppOne = Vec_WecEntry( vSupps, i );
        if ( Vec_IntSize(vSuppOne) == 0 )
            Vec_IntPush( vCoMapLit, Abc_Var2Lit(0, Gia_ObjFaninC0(pObj)) );
        else if ( Vec_IntSize(vSuppOne) == 1 )
            Vec_IntPush( vCoMapLit, Abc_Var2Lit(1, Gia_ObjFaninC0(pObj)) );
        else
        {
            Vec_IntForEachEntry( vSuppOne, iCi, k )
                Gia_ManCi(p, iCi)->Value = Gia_Obj2Lit(pNew, Gia_ManCi(pNew, k) );
            Gia_ManDupHashDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
            assert( Gia_ObjFanin0Copy(pObj) < 2 * Gia_ManObjNum(pNew) );
            Vec_IntPush( vCoMapLit, Gia_ObjFanin0Copy(pObj) );
            Gia_ManDupCleanDfs_rec( Gia_ObjFanin0(pObj) );
        }
    }
    Gia_ManHashStop( pNew );
    assert( Vec_IntSize(vCoMapLit) == Gia_ManCoNum(p) );
    if ( pvCoMap == NULL ) // do not remap
    {
        Vec_IntForEachEntry( vCoMapLit, iLit, i )
            Gia_ManAppendCo( pNew, iLit );
    }
    else // remap
    {
        Vec_Int_t * vCoMapRes = Vec_IntAlloc( Gia_ManCoNum(p) );      // map old CO into new CO 
        Vec_Int_t * vMap = Vec_IntStartFull( 2*Gia_ManObjNum(pNew) ); // map new lit into new CO
        Vec_IntForEachEntry( vCoMapLit, iLit, i )
        {
            if ( Vec_IntEntry(vMap, iLit) == -1 )
            {
                Vec_IntWriteEntry( vMap, iLit, Gia_ManCoNum(pNew) );
                Gia_ManAppendCo( pNew, iLit );
            }
            Vec_IntPush( vCoMapRes, Vec_IntEntry(vMap, iLit) );
        }
        Vec_IntFree( vMap );
        *pvCoMap = vCoMapRes;
    }
    Vec_IntFree( vCoMapLit );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}